

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineFactoryVk.h
# Opt level: O0

void __thiscall Diligent::IEngineFactoryVk::IEngineFactoryVk(IEngineFactoryVk *this)

{
  IEngineFactoryVk *this_local;
  
  IEngineFactory::IEngineFactory(&this->super_IEngineFactory);
  (this->super_IEngineFactory).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_010d0868;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(IEngineFactoryVk, IEngineFactory)
{
    /// Creates a render device and device contexts for Vulkan backend

    /// \param [in] EngineCI    - Engine creation attributes.
    /// \param [out] ppDevice   - Address of the memory location where pointer to
    ///                           the created device will be written
    /// \param [out] ppContexts - Address of the memory location where pointers to
    ///                           the contexts will be written. Immediate context goes at
    ///                           position 0. If EngineCI.NumDeferredContexts > 0,
    ///                           pointers to the deferred contexts are written afterwards.
    VIRTUAL void METHOD(CreateDeviceAndContextsVk)(THIS_
                                                   const EngineVkCreateInfo REF EngineCI,
                                                   IRenderDevice**              ppDevice,
                                                   IDeviceContext**             ppContexts) PURE;


    /// Creates a swap chain for Vulkan-based engine implementation

    /// \param [in] pDevice           - Pointer to the render device
    /// \param [in] pImmediateContext - Pointer to the immediate device context.
    ///                                 Swap chain creation will fail if the context can not present to the window.
    /// \param [in] SCDesc            - Swap chain description
    /// \param [in] Window            - Platform-specific native window description that
    ///                                 the swap chain will be associated with.
    ///
    /// \param [out] ppSwapChain    - Address of the memory location where pointer to the new
    ///                               swap chain will be written
    VIRTUAL void METHOD(CreateSwapChainVk)(THIS_
                                           IRenderDevice*          pDevice,
                                           IDeviceContext*         pImmediateContext,
                                           const SwapChainDesc REF SwapChainDesc,
                                           const NativeWindow REF  Window,
                                           ISwapChain**            ppSwapChain) PURE;

    /// Enable device simulation layer (if available).

    /// Vulkan instance will be created with the device simulation layer.
    /// Use VK_DEVSIM_FILENAME environment variable to define the path to the .json file.
    ///
    /// \remarks Use this function before calling EnumerateAdapters() and CreateDeviceAndContextsVk().
    VIRTUAL void METHOD(EnableDeviceSimulation)(THIS) PURE;
}